

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Quaternion
QuaternionCubicHermiteSpline
          (Quaternion q1,Quaternion outTangent1,Quaternion q2,Quaternion inTangent2,float t)

{
  float fVar1;
  float fVar2;
  Quaternion QVar3;
  Quaternion q2_00;
  Quaternion q2_01;
  Quaternion q2_02;
  
  fVar1 = t * t;
  fVar2 = fVar1 * t;
  QVar3 = QuaternionScale(q1,((fVar2 + fVar2) - fVar1 * 3.0) + 1.0);
  q2_00 = QuaternionScale(outTangent1,(fVar2 - (fVar1 + fVar1)) + t);
  q2_01 = QuaternionScale(q2,fVar1 * 3.0 - (fVar2 + fVar2));
  q2_02 = QuaternionScale(inTangent2,fVar2 - fVar1);
  QVar3 = QuaternionAdd(QVar3,q2_00);
  QVar3 = QuaternionAdd(QVar3,q2_01);
  QVar3 = QuaternionAdd(QVar3,q2_02);
  QVar3 = QuaternionNormalize(QVar3);
  return QVar3;
}

Assistant:

RMAPI Quaternion QuaternionCubicHermiteSpline(Quaternion q1, Quaternion outTangent1, Quaternion q2, Quaternion inTangent2, float t)
{
    float t2 = t*t;
    float t3 = t2*t;
    float h00 = 2*t3 - 3*t2 + 1;
    float h10 = t3 - 2*t2 + t;
    float h01 = -2*t3 + 3*t2;
    float h11 = t3 - t2;

    Quaternion p0 = QuaternionScale(q1, h00);
    Quaternion m0 = QuaternionScale(outTangent1, h10);
    Quaternion p1 = QuaternionScale(q2, h01);
    Quaternion m1 = QuaternionScale(inTangent2, h11);

    Quaternion result = { 0 };

    result = QuaternionAdd(p0, m0);
    result = QuaternionAdd(result, p1);
    result = QuaternionAdd(result, m1);
    result = QuaternionNormalize(result);

    return result;
}